

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O3

void google::protobuf::util::FieldMaskUtil::ToCanonicalForm(FieldMask *mask,FieldMask *out)

{
  undefined1 local_48 [8];
  FieldMaskTree tree;
  
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&tree;
  tree.root_.children._M_t._M_impl._0_4_ = 0;
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  anon_unknown_0::FieldMaskTree::MergeFromFieldMask((FieldMaskTree *)local_48,mask);
  FieldMask::Clear(out);
  anon_unknown_0::FieldMaskTree::MergeToFieldMask((FieldMaskTree *)local_48,out);
  anon_unknown_0::FieldMaskTree::Node::ClearChildren((Node *)local_48);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>_>
              *)tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
             (_Link_type)out);
  return;
}

Assistant:

void FieldMaskUtil::ToCanonicalForm(const FieldMask& mask, FieldMask* out) {
  FieldMaskTree tree;
  tree.MergeFromFieldMask(mask);
  out->Clear();
  tree.MergeToFieldMask(out);
}